

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc.c
# Opt level: O0

Aig_Man_t * Saig_ManFramesBmcLimit(Aig_Man_t *pAig,int nFrames,int nSizeMax)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t *p1;
  int local_54;
  int local_50;
  int Counter;
  int f;
  int i;
  Aig_Obj_t *pObjPo;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  int nSizeMax_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  iVar2 = Saig_ManRegNum(pAig);
  if (iVar2 < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc.c"
                  ,0x7f,"Aig_Man_t *Saig_ManFramesBmcLimit(Aig_Man_t *, int, int)");
  }
  p = Aig_ManStart(nSizeMax);
  Aig_ManIncrementTravId(p);
  pAVar3 = Aig_ManConst1(p);
  pAVar4 = Aig_ManConst1(pAig);
  (pAVar4->field_5).pData = pAVar3;
  for (Counter = 0; iVar2 = Saig_ManRegNum(pAig), Counter < iVar2; Counter = Counter + 1) {
    pVVar1 = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pvVar5 = Vec_PtrEntry(pVVar1,Counter + iVar2);
    pAVar3 = Aig_ManConst0(p);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  local_54 = 0;
  for (local_50 = 0; local_50 < nFrames; local_50 = local_50 + 1) {
    for (Counter = 0; iVar2 = Saig_ManPiNum(pAig), Counter < iVar2; Counter = Counter + 1) {
      pvVar5 = Vec_PtrEntry(pAig->vCis,Counter);
      pAVar3 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
    }
    for (Counter = 0; iVar2 = Vec_PtrSize(pAig->vObjs), Counter < iVar2; Counter = Counter + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,Counter);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar3), iVar2 != 0)) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        p1 = Aig_ObjChild1Copy(pAVar3);
        pAVar4 = Aig_And(p,pAVar4,p1);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    for (Counter = 0; iVar2 = Saig_ManPoNum(pAig), Counter < iVar2; Counter = Counter + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,Counter);
      pAVar3 = Aig_ObjChild0Copy(pAVar3);
      pAVar3 = Aig_ObjCreateCo(p,pAVar3);
      pAVar3 = Aig_ObjFanin0(pAVar3);
      iVar2 = Saig_ManFramesCount_rec(p,pAVar3);
      local_54 = iVar2 + local_54;
    }
    if (nSizeMax <= local_54) {
      Aig_ManCleanup(p);
      return p;
    }
    if (local_50 == nFrames + -1) break;
    for (Counter = 0; iVar2 = Saig_ManRegNum(pAig), Counter < iVar2; Counter = Counter + 1) {
      pVVar1 = pAig->vCos;
      iVar2 = Saig_ManPoNum(pAig);
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,Counter + iVar2);
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      (pAVar3->field_5).pData = pAVar4;
    }
    for (Counter = 0; iVar2 = Saig_ManRegNum(pAig), Counter < iVar2; Counter = Counter + 1) {
      pAVar3 = Saig_ManLi(pAig,Counter);
      pAVar4 = Saig_ManLo(pAig,Counter);
      pAVar4->field_5 = pAVar3->field_5;
    }
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManFramesBmcLimit( Aig_Man_t * pAig, int nFrames, int nSizeMax )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjPo;
    int i, f, Counter = 0;
    assert( Saig_ManRegNum(pAig) > 0 );
    pFrames = Aig_ManStart( nSizeMax );
    Aig_ManIncrementTravId( pFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_ManConst0( pFrames );
    // add timeframes
    Counter = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // create POs for this frame
        Saig_ManForEachPo( pAig, pObj, i )
        {
            pObjPo = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Copy(pObj) );
            Counter += Saig_ManFramesCount_rec( pFrames, Aig_ObjFanin0(pObjPo) );
        }
        if ( Counter >= nSizeMax )
        {
            Aig_ManCleanup( pFrames );
            return pFrames;
        }
        if ( f == nFrames - 1 )
            break;
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
            pObjLo->pData = pObjLi->pData;
    }
    Aig_ManCleanup( pFrames );
    return pFrames;
}